

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_archive.cpp
# Opt level: O0

bool __thiscall ON_BinaryArchive::BeginWrite3dmChunk(ON_BinaryArchive *this,uint typecode,int value)

{
  bool bVar1;
  ON__UINT64 u64;
  ulong uStack_20;
  ON__UINT32 u32;
  ON__INT64 value64;
  int value_local;
  uint typecode_local;
  ON_BinaryArchive *this_local;
  
  uStack_20 = 0;
  if (value != 0) {
    bVar1 = ON_IsUnsignedChunkTypecode(typecode);
    if (bVar1) {
      uStack_20 = (ulong)(uint)value;
    }
    else {
      uStack_20 = (ulong)value;
    }
  }
  bVar1 = BeginWrite3dmBigChunk(this,typecode,uStack_20);
  return bVar1;
}

Assistant:

bool ON_BinaryArchive::BeginWrite3dmChunk( unsigned int typecode, int value )
{
  ON__INT64 value64 = 0;
  if ( 0 != value )
  {
    if ( ON_IsUnsignedChunkTypecode(typecode) )
    {
      // treat value parameter as an unsigned int
      ON__UINT32 u32 = (ON__UINT32)value;
      ON__UINT64 u64 = u32;
      value64 = (ON__INT64)u64;
    }
    else
    {
      // treat value paramter is a signed int
      value64 = value;
    }
  }
  return BeginWrite3dmBigChunk(typecode,value64);
}